

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O3

sysbvm_tuple_t
sysbvm_astIdentifierReferenceNode_primitiveEvaluate
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  sysbvm_tuple_t sVar1;
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord;
  sysbvm_stackFrameRecord_t local_30;
  undefined8 local_20;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  local_30.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_30.type = SYSBVM_STACK_FRAME_RECORD_TYPE_SOURCE_POSITION;
  local_20 = *(undefined8 *)(*arguments + 0x10);
  sysbvm_stackFrame_pushRecord(&local_30);
  sVar1 = sysbvm_environment_evaluateSymbolBinding
                    (context,arguments[1],*(sysbvm_tuple_t *)(*arguments + 0x30));
  sysbvm_stackFrame_popRecord(&local_30);
  return sVar1;
}

Assistant:

static sysbvm_tuple_t sysbvm_astIdentifierReferenceNode_primitiveEvaluate(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_tuple_t *environment = &arguments[1];

    sysbvm_astIdentifierReferenceNode_t **referenceNode = (sysbvm_astIdentifierReferenceNode_t**)node;
    SYSBVM_STACKFRAME_PUSH_SOURCE_POSITION(sourcePositionRecord, (*referenceNode)->super.sourcePosition);

    sysbvm_tuple_t result = sysbvm_environment_evaluateSymbolBinding(context, *environment, (*referenceNode)->binding);
    SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
    return result;
}